

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

bool __thiscall gl4cts::DirectStateAccess::Framebuffers::BlitTest::CheckStencil(BlitTest *this)

{
  GLint *pGVar1;
  GLint *pGVar2;
  ostringstream *this_00;
  int iVar3;
  deUint32 err;
  undefined4 extraout_var;
  GLint (*paGVar4) [3];
  MessageBuilder *pMVar5;
  long lVar6;
  GLint (*paGVar7) [3];
  ulong uVar8;
  GLint stencil [2] [3];
  undefined1 local_1a0 [384];
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  paGVar7 = stencil;
  stencil[0][0] = 0;
  stencil[0][1] = 0;
  stencil[0][2] = 0;
  stencil[1][0] = 0;
  stencil[1][1] = 0;
  stencil[1][2] = 0;
  uVar8 = 0;
  (**(code **)(CONCAT44(extraout_var,iVar3) + 0x1220))(0,0,3,2,0x1901,0x1404,paGVar7);
  err = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
  glu::checkError(err,"glReadPixels has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xbc1);
  paGVar4 = CheckStencil::reference;
  do {
    if (uVar8 == 2) {
LAB_00b0489b:
      return 1 < uVar8;
    }
    lVar6 = 0;
    while (lVar6 != 3) {
      pGVar1 = *paGVar4 + lVar6;
      pGVar2 = *paGVar7 + lVar6;
      lVar6 = lVar6 + 1;
      if (*pGVar1 != *pGVar2) {
        local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        this_00 = (ostringstream *)(local_1a0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,"Blitted framebuffer stencil buffer contains [");
        std::ostream::operator<<(this_00,stencil[0][0]);
        std::operator<<((ostream *)this_00,", ");
        std::ostream::operator<<(this_00,stencil[0][1]);
        std::operator<<((ostream *)this_00,", ");
        std::ostream::operator<<(this_00,stencil[0][2]);
        std::operator<<((ostream *)this_00,", \n");
        std::ostream::operator<<(this_00,stencil[1][0]);
        std::operator<<((ostream *)this_00,", ");
        std::ostream::operator<<(this_00,stencil[1][1]);
        std::operator<<((ostream *)this_00,", ");
        std::ostream::operator<<(this_00,stencil[1][2]);
        std::operator<<((ostream *)this_00,"], but ");
        pMVar5 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1a0,CheckStencil::reference[0]);
        std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,CheckStencil::reference[0] + 1);
        std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,CheckStencil::reference[0] + 2);
        std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", \n");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,CheckStencil::reference[1]);
        std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,CheckStencil::reference[1] + 1);
        std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,CheckStencil::reference[1] + 2);
        std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                        "] was expected.");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        goto LAB_00b0489b;
      }
    }
    uVar8 = uVar8 + 1;
    paGVar4 = paGVar4 + 1;
    paGVar7 = paGVar7 + 1;
  } while( true );
}

Assistant:

bool BlitTest::CheckStencil()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reference values. */
	static const glw::GLint reference[2][3] = { { 1, 2, 3 }, { 4, 4, 4 } };

	/* Copy buffer. */
	glw::GLint stencil[2][3] = { { 0 } };

	/* Reading from GL. */
	gl.readPixels(0, 0, 3, 2, GL_STENCIL_INDEX, GL_INT, stencil);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

	/* Comparison against the reference. */
	for (glw::GLuint j = 0; j < 2; ++j)
	{
		for (glw::GLuint i = 0; i < 3; ++i)
		{
			if (reference[j][i] != stencil[j][i])
			{
				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Blitted framebuffer stencil buffer contains [" << stencil[0][0] << ", "
					<< stencil[0][1] << ", " << stencil[0][2] << ", \n"
					<< stencil[1][0] << ", " << stencil[1][1] << ", " << stencil[1][2] << "], but " << reference[0][0]
					<< ", " << reference[0][1] << ", " << reference[0][2] << ", \n"
					<< reference[1][0] << ", " << reference[1][1] << ", " << reference[1][2] << "] was expected."
					<< tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	return true;
}